

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall inja::FileError::~FileError(FileError *this)

{
  FileError *this_local;
  
  ~FileError(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit FileError(const std::string& message): InjaError("file_error", message) {}